

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcppacketbuilder.cpp
# Opt level: O3

int __thiscall
jrtplib::RTCPPacketBuilder::BuildBYEPacket
          (RTCPPacketBuilder *this,RTCPCompoundPacket **pack,void *reason,size_t reasonlength,
          bool useSRifpossible)

{
  RTPMemoryManager *pRVar1;
  RTPInternalSourceData *pRVar2;
  uint8_t *itemdata;
  size_t sVar3;
  RTPPacketBuilder *pRVar4;
  int iVar5;
  uint32_t uVar6;
  int iVar7;
  RTCPCompoundPacketBuilder *this_00;
  uint32_t senderssrc;
  uint32_t packetcount;
  uint32_t octetcount;
  size_t sVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  uint32_t ssrcs [1];
  timespec tpMono;
  timespec local_50;
  timespec local_40;
  
  if (this->init != true) {
    return -0x32;
  }
  sVar8 = 0xff;
  if (reasonlength < 0xff) {
    sVar8 = reasonlength;
  }
  *pack = (RTCPCompoundPacket *)0x0;
  pRVar1 = (this->super_RTPMemoryObject).mgr;
  if (pRVar1 == (RTPMemoryManager *)0x0) {
    this_00 = (RTCPCompoundPacketBuilder *)operator_new(0x130);
  }
  else {
    this_00 = (RTCPCompoundPacketBuilder *)(**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,0x130,0x11);
  }
  RTCPCompoundPacketBuilder::RTCPCompoundPacketBuilder(this_00,(this->super_RTPMemoryObject).mgr);
  iVar5 = RTCPCompoundPacketBuilder::InitBuild(this_00,this->maxpacketsize);
  if (iVar5 < 0) {
LAB_0012b1e3:
    pRVar1 = (this->super_RTPMemoryObject).mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      if (this_00 != (RTCPCompoundPacketBuilder *)0x0) {
        (*(this_00->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject[1])
                  (this_00);
      }
    }
    else {
      (**(this_00->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject)(this_00);
      (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1,this_00);
    }
  }
  else {
    senderssrc = 0;
    if (this->rtppacketbuilder->init != false) {
      senderssrc = this->rtppacketbuilder->ssrc;
    }
    if (((useSRifpossible) &&
        (pRVar2 = this->sources->owndata, pRVar2 != (RTPInternalSourceData *)0x0)) &&
       ((pRVar2->super_RTPSourceData).issender == true)) {
      if (RTPTime::CurrentTime()::s_initialized == '\0') {
        RTPTime::CurrentTime()::s_initialized = '\x01';
        clock_gettime(0,&local_50);
        clock_gettime(1,&local_40);
        dVar10 = (double)local_50.tv_nsec * 1e-09 + (double)local_50.tv_sec;
        RTPTime::CurrentTime()::s_startOffet =
             dVar10 - ((double)local_40.tv_nsec * 1e-09 + (double)local_40.tv_sec);
      }
      else {
        clock_gettime(1,&local_50);
        dVar10 = (double)local_50.tv_nsec * 1e-09 + (double)local_50.tv_sec +
                 RTPTime::CurrentTime()::s_startOffet;
      }
      pRVar4 = this->rtppacketbuilder;
      uVar6 = 0;
      bVar9 = pRVar4->init != false;
      if (bVar9) {
        dVar11 = (pRVar4->lastwallclocktime).m_t;
      }
      else {
        dVar11 = 0.0;
      }
      packetcount = 0;
      octetcount = 0;
      if (bVar9) {
        uVar6 = pRVar4->lastrtptimestamp;
        packetcount = pRVar4->numpackets;
        octetcount = pRVar4->numpayloadbytes;
      }
      local_50.tv_sec =
           (ulong)((int)(long)dVar10 + 0x83aa7e80) |
           (long)(((double)((long)((dVar10 - (double)((long)dVar10 & 0xffffffff)) * 1000000.0) &
                           0xffffffff) / 1000000.0) * 4294967296.0) << 0x20;
      iVar7 = RTCPCompoundPacketBuilder::StartSenderReport
                        (this_00,senderssrc,(RTPNTPTime *)&local_50,
                         (int)(long)((dVar10 - dVar11) / this->timestampunit + 0.5) + uVar6,
                         packetcount,octetcount);
    }
    else {
      iVar7 = RTCPCompoundPacketBuilder::StartReceiverReport(this_00,senderssrc);
    }
    if (-1 < iVar7) {
      itemdata = (this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[0].str;
      sVar3 = (this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[0].length;
      iVar7 = RTCPCompoundPacketBuilder::AddSDESSource(this_00,senderssrc);
      if ((-1 < iVar7) &&
         (iVar7 = RTCPCompoundPacketBuilder::AddSDESNormalItem
                            (this_00,CNAME,itemdata,(uint8_t)sVar3), -1 < iVar7)) {
        local_50.tv_sec = CONCAT44(local_50.tv_sec._4_4_,senderssrc);
        iVar5 = RTCPCompoundPacketBuilder::AddBYEPacket
                          (this_00,(uint32_t *)&local_50,'\x01',reason,(uint8_t)sVar8);
        if (iVar5 < 0) {
          pRVar1 = (this->super_RTPMemoryObject).mgr;
          if (pRVar1 == (RTPMemoryManager *)0x0) {
            if (this_00 != (RTCPCompoundPacketBuilder *)0x0) {
              (*(this_00->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject[1])
                        (this_00);
            }
          }
          else {
            (**(this_00->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject)
                      (this_00);
            (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1,this_00);
          }
          if (iVar5 == -0x2b) {
            return -0x33;
          }
          return iVar5;
        }
        iVar5 = RTCPCompoundPacketBuilder::EndBuild(this_00);
        if (-1 < iVar5) {
          *pack = &this_00->super_RTCPCompoundPacket;
          return 0;
        }
        goto LAB_0012b1e3;
      }
    }
    pRVar1 = (this->super_RTPMemoryObject).mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      if (this_00 != (RTCPCompoundPacketBuilder *)0x0) {
        (*(this_00->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject[1])
                  (this_00);
      }
    }
    else {
      (**(this_00->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject)(this_00);
      (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1,this_00);
    }
    iVar5 = -0x33;
    if (iVar7 != -0x2b) {
      iVar5 = iVar7;
    }
  }
  return iVar5;
}

Assistant:

int RTCPPacketBuilder::BuildBYEPacket(RTCPCompoundPacket **pack,const void *reason,size_t reasonlength,bool useSRifpossible)
{
	if (!init)
		return ERR_RTP_RTCPPACKETBUILDER_NOTINIT;

	RTCPCompoundPacketBuilder *rtcpcomppack;
	int status;
	
	if (reasonlength > 255)
		reasonlength = 255;
	
	*pack = 0;
	
	rtcpcomppack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPCOMPOUNDPACKETBUILDER) RTCPCompoundPacketBuilder(GetMemoryManager());
	if (rtcpcomppack == 0)
		return ERR_RTP_OUTOFMEM;
	
	if ((status = rtcpcomppack->InitBuild(maxpacketsize)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		return status;
	}
	
	uint32_t ssrc = rtppacketbuilder.GetSSRC();
	bool useSR = false;
	
	if (useSRifpossible)
	{
		RTPSourceData *srcdat;
		
		if ((srcdat = sources.GetOwnSourceInfo()) != 0)
		{
			if (srcdat->IsSender())
				useSR = true;
		}
	}
			
	if (useSR)
	{
		RTPTime curtime = RTPTime::CurrentTime();
		RTPTime rtppacktime = rtppacketbuilder.GetPacketTime();
		uint32_t rtppacktimestamp = rtppacketbuilder.GetPacketTimestamp();
		uint32_t packcount = rtppacketbuilder.GetPacketCount();
		uint32_t octetcount = rtppacketbuilder.GetPayloadOctetCount();
		RTPTime diff = curtime;
		diff -= rtppacktime;
		
		uint32_t tsdiff = (uint32_t)((diff.GetDouble()/timestampunit)+0.5);
		uint32_t rtptimestamp = rtppacktimestamp+tsdiff;
		RTPNTPTime ntptimestamp = curtime.GetNTPTime();

		if ((status = rtcpcomppack->StartSenderReport(ssrc,ntptimestamp,rtptimestamp,packcount,octetcount)) < 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
			return status;
		}
	}
	else
	{
		if ((status = rtcpcomppack->StartReceiverReport(ssrc)) < 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
			return status;
		}
	}

	uint8_t *owncname;
	size_t owncnamelen;

	owncname = ownsdesinfo.GetCNAME(&owncnamelen);

	if ((status = rtcpcomppack->AddSDESSource(ssrc)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		return status;
	}
	if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::CNAME,owncname,owncnamelen)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		return status;
	}

	uint32_t ssrcs[1];

	ssrcs[0] = ssrc;
	
	if ((status = rtcpcomppack->AddBYEPacket(ssrcs,1,(const uint8_t *)reason,reasonlength)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		return status;
	}
	
	if ((status = rtcpcomppack->EndBuild()) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		return status;
	}

	*pack = rtcpcomppack;
	return 0;
}